

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O1

xer_pbd_rval
INTEGER__xer_body_decode(asn_TYPE_descriptor_t *td,void *sptr,void *chunk_buf,size_t chunk_size)

{
  byte *pbVar1;
  byte bVar2;
  void *__ptr;
  undefined8 *puVar3;
  asn_strtol_result_e aVar4;
  uint uVar5;
  int iVar6;
  xer_pbd_rval xVar7;
  void *pvVar8;
  long *plVar9;
  int iVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  byte *pbVar14;
  byte *pbVar15;
  byte *pbVar16;
  char cVar17;
  long dec_value;
  char *dec_value_end;
  byte *local_98;
  long local_90;
  byte *local_88;
  byte *local_80;
  byte *local_78;
  byte *local_70;
  long local_68;
  size_t local_60;
  asn_TYPE_descriptor_t *local_58;
  byte *local_50;
  byte *local_48;
  void *local_40;
  long local_38;
  
  local_88 = (byte *)0x0;
  pvVar8 = malloc((long)((int)(chunk_size / 3) + 2));
  if (pvVar8 == (void *)0x0) {
    return XPBD_SYSTEM_FAILURE;
  }
  pbVar1 = (byte *)((long)chunk_buf + chunk_size);
  __ptr = *sptr;
  *(undefined4 *)((long)sptr + 8) = 0;
  *(void **)sptr = pvVar8;
  free(__ptr);
  if ((long)chunk_size < 1) {
    uVar5 = 0;
    local_98 = (byte *)0x0;
  }
  else {
    pbVar14 = (byte *)((long)chunk_buf - 1);
    pbVar15 = (byte *)((long)chunk_buf + 1);
    pbVar16 = pbVar1 + -1;
    local_68 = chunk_size - 1;
    cVar17 = '\0';
    local_98 = (byte *)0x0;
    uVar5 = 0;
    local_60 = chunk_size;
    local_58 = td;
    do {
      bVar2 = *chunk_buf;
      switch(bVar2) {
      case 0x2b:
      case 0x2d:
        if (uVar5 == 0) {
          uVar5 = 2;
LAB_00140a61:
          local_90 = 0;
          iVar6 = 4;
          local_98 = (byte *)chunk_buf;
          goto LAB_00140b8e;
        }
        break;
      case 0x2c:
      case 0x2e:
      case 0x2f:
      case 0x3b:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5b:
      case 0x5c:
      case 0x5d:
      case 0x5e:
      case 0x5f:
      case 0x60:
        break;
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        iVar6 = 4;
        switch(uVar5) {
        case 0:
          uVar5 = 3;
          goto LAB_00140a61;
        case 1:
        case 5:
          cVar17 = bVar2 * '\x10';
          uVar5 = 6;
          break;
        case 2:
        case 3:
          uVar5 = 3;
          break;
        default:
          goto switchD_001408dc_caseD_2c;
        case 6:
          cVar17 = cVar17 + (bVar2 - 0x30);
LAB_001409ce:
          iVar6 = 4;
          iVar10 = *(int *)((long)sptr + 8);
          *(int *)((long)sptr + 8) = iVar10 + 1;
          *(char *)(*sptr + (long)iVar10) = cVar17;
          uVar5 = 8;
          break;
        case 8:
          iVar6 = 1;
        }
        goto LAB_00140b8e;
      case 0x3a:
        iVar6 = 4;
        if (uVar5 == 8) {
          uVar5 = 5;
          goto LAB_00140b8e;
        }
        if (uVar5 == 3) goto switchD_001408fd_caseD_3;
        break;
      case 0x3c:
        iVar6 = 1;
        if (uVar5 != 0) goto LAB_00140b8e;
        puVar3 = (undefined8 *)local_58->specifics;
        if (puVar3 == (undefined8 *)0x0) {
          iVar10 = 0;
        }
        else {
          iVar10 = *(int *)(puVar3 + 2);
        }
        if (iVar10 == 0) {
LAB_00140b4b:
          plVar9 = (long *)0x0;
        }
        else {
          pbVar12 = pbVar15;
          pbVar11 = pbVar15;
          lVar13 = local_68;
          if (local_60 != 1) {
            do {
              if (((ulong)*pbVar11 < 0x3f) &&
                 (pbVar12 = pbVar11, (0x4000800100003e00U >> ((ulong)*pbVar11 & 0x3f) & 1) != 0))
              break;
              lVar13 = lVar13 + -1;
              pbVar12 = pbVar1;
              pbVar11 = pbVar11 + 1;
            } while (lVar13 != 0);
          }
          if (pbVar12 == pbVar1) goto LAB_00140b4b;
          local_40 = (void *)*puVar3;
          local_38 = puVar3[1];
          local_80 = pbVar16;
          local_78 = pbVar15;
          local_70 = pbVar14;
          local_50 = pbVar15;
          local_48 = pbVar12;
          pvVar8 = bsearch(&local_50,local_40,(long)iVar10,0x18,INTEGER__compar_enum2value);
          pbVar14 = local_70;
          pbVar15 = local_78;
          pbVar16 = local_80;
          if (pvVar8 == (void *)0x0) {
            plVar9 = (long *)0x0;
          }
          else {
            plVar9 = (long *)((long)local_40 +
                             (ulong)*(uint *)(local_38 +
                                             ((long)pvVar8 - (long)local_40 >> 1) *
                                             -0x5555555555555555) * 0x18);
          }
        }
        if (plVar9 == (long *)0x0) {
          uVar5 = 0;
        }
        else {
          local_90 = *plVar9;
          iVar6 = 4;
          uVar5 = 9;
          chunk_buf = pbVar16;
        }
        goto LAB_00140b8e;
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x61:
      case 0x62:
      case 99:
      case 100:
      case 0x65:
      case 0x66:
        iVar6 = 4;
        switch(uVar5) {
        case 0:
        case 1:
        case 5:
          cVar17 = bVar2 * '\x10' + -0x70;
          uVar5 = 6;
          break;
        default:
          goto switchD_001408dc_caseD_2c;
        case 3:
switchD_001408fd_caseD_3:
          iVar6 = 4;
          uVar5 = 1;
          local_98 = (byte *)0x0;
          chunk_buf = pbVar14;
          break;
        case 6:
          cVar17 = cVar17 + bVar2 + ((char)bVar2 < 'a') * ' ' + -0x57;
          goto LAB_001409ce;
        }
        goto LAB_00140b8e;
      default:
        if (((bVar2 < 0x21) && ((0x100002600U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) &&
           (uVar5 < 9)) {
          iVar6 = 4;
          if ((0x93U >> uVar5 & 1) == 0) {
            if (uVar5 == 3) {
              uVar5 = 4;
              local_88 = (byte *)chunk_buf;
            }
            else {
              if (uVar5 != 8) break;
              uVar5 = 7;
            }
          }
          goto LAB_00140b8e;
        }
      }
switchD_001408dc_caseD_2c:
      iVar6 = 2;
      uVar5 = 10;
LAB_00140b8e:
      if (iVar6 != 4) {
        if (iVar6 != 2) {
          return XPBD_BROKEN_ENCODING;
        }
        break;
      }
      chunk_buf = (void *)((long)chunk_buf + 1);
    } while (chunk_buf < pbVar1);
  }
  xVar7 = XPBD_BROKEN_ENCODING;
  switch(uVar5) {
  case 0:
    xVar7 = XPBD_NOT_BODY_IGNORE;
    break;
  case 1:
  case 2:
  case 5:
  case 6:
  case 10:
    break;
  case 3:
    local_88 = pbVar1;
  case 4:
    aVar4 = asn_strtol_lim((char *)local_98,(char **)&local_88,&local_90);
    uVar5 = aVar4 + 3;
    if ((uVar5 < 5) && ((0x17U >> (uVar5 & 0x1f) & 1) != 0)) {
      xVar7 = *(xer_pbd_rval *)(&DAT_00165f60 + (ulong)uVar5 * 4);
    }
    else {
switchD_00140bdd_caseD_9:
      iVar6 = asn_long2INTEGER((INTEGER_t *)sptr,local_90);
      xVar7 = (uint)(iVar6 == 0) << 2;
    }
    break;
  case 7:
  case 8:
    *(undefined1 *)(*sptr + (long)*(int *)((long)sptr + 8)) = 0;
    xVar7 = XPBD_BODY_CONSUMED;
    break;
  default:
    goto switchD_00140bdd_caseD_9;
  }
  return xVar7;
}

Assistant:

static enum xer_pbd_rval
INTEGER__xer_body_decode(asn_TYPE_descriptor_t *td, void *sptr, const void *chunk_buf, size_t chunk_size) {
	INTEGER_t *st = (INTEGER_t *)sptr;
	long dec_value;
	long hex_value = 0;
	const char *lp;
	const char *lstart = (const char *)chunk_buf;
	const char *lstop = lstart + chunk_size;
	enum {
		ST_LEADSPACE,
		ST_SKIPSPHEX,
		ST_WAITDIGITS,
		ST_DIGITS,
		ST_DIGITS_TRAILSPACE,
		ST_HEXDIGIT1,
		ST_HEXDIGIT2,
		ST_HEXDIGITS_TRAILSPACE,
		ST_HEXCOLON,
		ST_END_ENUM,
		ST_UNEXPECTED
	} state = ST_LEADSPACE;
	const char *dec_value_start = 0; /* INVARIANT: always !0 in ST_DIGITS */
	const char *dec_value_end = 0;

	if(chunk_size)
		ASN_DEBUG("INTEGER body %ld 0x%2x..0x%2x",
			(long)chunk_size, *lstart, lstop[-1]);

	if(INTEGER_st_prealloc(st, (chunk_size/3) + 1))
		return XPBD_SYSTEM_FAILURE;

	/*
	 * We may have received a tag here. It will be processed inline.
	 * Use strtoul()-like code and serialize the result.
	 */
	for(lp = lstart; lp < lstop; lp++) {
		int lv = *lp;
		switch(lv) {
		case 0x09: case 0x0a: case 0x0d: case 0x20:
			switch(state) {
			case ST_LEADSPACE:
			case ST_DIGITS_TRAILSPACE:
			case ST_HEXDIGITS_TRAILSPACE:
			case ST_SKIPSPHEX:
				continue;
			case ST_DIGITS:
				dec_value_end = lp;
				state = ST_DIGITS_TRAILSPACE;
				continue;
			case ST_HEXCOLON:
				state = ST_HEXDIGITS_TRAILSPACE;
				continue;
			default:
				break;
			}
			break;
		case 0x2d:	/* '-' */
			if(state == ST_LEADSPACE) {
				dec_value = 0;
				dec_value_start = lp;
				state = ST_WAITDIGITS;
				continue;
			}
			break;
		case 0x2b:	/* '+' */
			if(state == ST_LEADSPACE) {
				dec_value = 0;
				dec_value_start = lp;
				state = ST_WAITDIGITS;
				continue;
			}
			break;
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34:
		case 0x35: case 0x36: case 0x37: case 0x38: case 0x39:
			switch(state) {
			case ST_DIGITS: continue;
			case ST_SKIPSPHEX:	/* Fall through */
			case ST_HEXDIGIT1:
				hex_value = (lv - 0x30) << 4;
				state = ST_HEXDIGIT2;
				continue;
			case ST_HEXDIGIT2:
				hex_value += (lv - 0x30);
				state = ST_HEXCOLON;
				st->buf[st->size++] = (uint8_t)hex_value;
				continue;
			case ST_HEXCOLON:
				return XPBD_BROKEN_ENCODING;
			case ST_LEADSPACE:
				dec_value = 0;
				dec_value_start = lp;
				/* FALL THROUGH */
			case ST_WAITDIGITS:
				state = ST_DIGITS;
				continue;
			default:
				break;
			}
			break;
		case 0x3c:	/* '<', start of XML encoded enumeration */
			if(state == ST_LEADSPACE) {
				const asn_INTEGER_enum_map_t *el;
				el = INTEGER_map_enum2value(
					(asn_INTEGER_specifics_t *)
					td->specifics, lstart, lstop);
				if(el) {
					ASN_DEBUG("Found \"%s\" => %ld",
						el->enum_name, el->nat_value);
					dec_value = el->nat_value;
					state = ST_END_ENUM;
					lp = lstop - 1;
					continue;
				}
				ASN_DEBUG("Unknown identifier for INTEGER");
			}
			return XPBD_BROKEN_ENCODING;
		case 0x3a:	/* ':' */
			if(state == ST_HEXCOLON) {
				/* This colon is expected */
				state = ST_HEXDIGIT1;
				continue;
			} else if(state == ST_DIGITS) {
				/* The colon here means that we have
				 * decoded the first two hexadecimal
				 * places as a decimal value.
				 * Switch decoding mode. */
				ASN_DEBUG("INTEGER re-evaluate as hex form");
				state = ST_SKIPSPHEX;
				dec_value_start = 0;
				lp = lstart - 1;
				continue;
			} else {
				ASN_DEBUG("state %d at %ld", state, (long)(lp - lstart));
				break;
			}
		/* [A-Fa-f] */
		case 0x41:case 0x42:case 0x43:case 0x44:case 0x45:case 0x46:
		case 0x61:case 0x62:case 0x63:case 0x64:case 0x65:case 0x66:
			switch(state) {
			case ST_SKIPSPHEX:
			case ST_LEADSPACE: /* Fall through */
			case ST_HEXDIGIT1:
				hex_value = lv - ((lv < 0x61) ? 0x41 : 0x61);
				hex_value += 10;
				hex_value <<= 4;
				state = ST_HEXDIGIT2;
				continue;
			case ST_HEXDIGIT2:
				hex_value += lv - ((lv < 0x61) ? 0x41 : 0x61);
				hex_value += 10;
				st->buf[st->size++] = (uint8_t)hex_value;
				state = ST_HEXCOLON;
				continue;
			case ST_DIGITS:
				ASN_DEBUG("INTEGER re-evaluate as hex form");
				state = ST_SKIPSPHEX;
				dec_value_start = 0;
				lp = lstart - 1;
				continue;
			default:
				break;
			}
			break;
		}

		/* Found extra non-numeric stuff */
		ASN_DEBUG("INTEGER :: Found non-numeric 0x%2x at %ld",
			lv, (long)(lp - lstart));
		state = ST_UNEXPECTED;
		break;
	}

	switch(state) {
	case ST_END_ENUM:
		/* Got a complete and valid enumeration encoded as a tag. */
		break;
	case ST_DIGITS:
		dec_value_end = lstop;
		/* FALL THROUGH */
	case ST_DIGITS_TRAILSPACE:
		/* The last symbol encountered was a digit. */
		switch(asn_strtol_lim(dec_value_start, &dec_value_end, &dec_value)) {
		case ASN_STRTOL_OK:
			break;
		case ASN_STRTOL_ERROR_RANGE:
			return XPBD_DECODER_LIMIT;
		case ASN_STRTOL_ERROR_INVAL:
		case ASN_STRTOL_EXPECT_MORE:
		case ASN_STRTOL_EXTRA_DATA:
			return XPBD_BROKEN_ENCODING;
		}
		break;
	case ST_HEXCOLON:
	case ST_HEXDIGITS_TRAILSPACE:
		st->buf[st->size] = 0;	/* Just in case termination */
		return XPBD_BODY_CONSUMED;
	case ST_HEXDIGIT1:
	case ST_HEXDIGIT2:
	case ST_SKIPSPHEX:
		return XPBD_BROKEN_ENCODING;
	case ST_LEADSPACE:
		/* Content not found */
		return XPBD_NOT_BODY_IGNORE;
	case ST_WAITDIGITS:
	case ST_UNEXPECTED:
		ASN_DEBUG("INTEGER: No useful digits (state %d)", state);
		return XPBD_BROKEN_ENCODING;	/* No digits */
	}

	/*
	 * Convert the result of parsing of enumeration or a straight
	 * decimal value into a BER representation.
	 */
	if(asn_long2INTEGER(st, dec_value))
		return XPBD_SYSTEM_FAILURE;

	return XPBD_BODY_CONSUMED;
}